

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

Diagnostics * __thiscall
slang::DiagnosticEngine::setMappingsFromPragmas
          (Diagnostics *__return_storage_ptr__,DiagnosticEngine *this)

{
  EntryPointer psVar1;
  SourceManager *pSVar2;
  EntryPointer psVar3;
  size_t sVar4;
  pointer pDVar5;
  long lVar6;
  long lVar7;
  EntryPointer psVar8;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> directives;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  pSVar2 = this->sourceManager;
  psVar3 = (pSVar2->diagDirectives).
           super_sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
           .entries;
  psVar8 = psVar3 + -1;
  lVar6 = 0x28;
  do {
    lVar6 = lVar6 + -0x28;
    psVar1 = psVar8 + 1;
    psVar8 = psVar8 + 1;
  } while (psVar1->distance_from_desired < '\0');
  sVar4 = (pSVar2->diagDirectives).
          super_sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
          .num_slots_minus_one;
  lVar7 = (long)(pSVar2->diagDirectives).
                super_sherwood_v3_table<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::BufferID,_slang::Hasher<slang::BufferID>,_ska::detailv3::KeyOrValueHasher<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_slang::Hasher<slang::BufferID>_>,_std::equal_to<slang::BufferID>,_ska::detailv3::KeyOrValueEquality<slang::BufferID,_std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>,_std::equal_to<slang::BufferID>_>,_std::allocator<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>_>_>
                .max_lookups;
  if (sVar4 * 0x28 + lVar7 * 0x28 + lVar6 != 0) {
    do {
      pDVar5 = (psVar8->field_1).value.second.
               super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      directives.size_ =
           (long)*(pointer *)
                  ((long)&(psVar8->field_1).value.second.
                          super__Vector_base<slang::SourceManager::DiagnosticDirectiveInfo,_std::allocator<slang::SourceManager::DiagnosticDirectiveInfo>_>
                          ._M_impl + 8) - (long)pDVar5 >> 5;
      directives.data_ = pDVar5;
      setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
                (this,(BufferID)(psVar8->field_1).value.first.id,directives,__return_storage_ptr__);
      do {
        psVar1 = psVar8 + 1;
        psVar8 = psVar8 + 1;
      } while (psVar1->distance_from_desired < '\0');
    } while (psVar8 != psVar3 + sVar4 + lVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas() {
    Diagnostics diags;
    sourceManager.visitDiagnosticDirectives([&](BufferID buffer, auto& directives) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    });

    return diags;
}